

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O3

bool ProcessArray<aiVector3t<float>>
               (aiVector3t<float> **in,uint num,char *name,
               vector<bool,_std::allocator<bool>_> *dirtyMask,bool mayBeIdentical,bool mayBeZero)

{
  float fVar1;
  float fVar2;
  float fVar3;
  _Bit_type *p_Var4;
  uint uVar5;
  Logger *this;
  ostream *this_00;
  char *pcVar6;
  bool bVar7;
  aiVector3t<float> *paVar8;
  char *pcVar9;
  ulong uVar10;
  bool bVar11;
  _IEEESingle temp;
  _IEEESingle temp_1;
  _IEEESingle temp_2;
  char *err;
  char *local_1d8;
  char *local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1a8 [112];
  ios_base local_138 [264];
  
  uVar5 = 0;
  if (num != 0) {
    paVar8 = *in;
    p_Var4 = (dirtyMask->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    bVar11 = true;
    pcVar6 = "INF/NAN was found in a vector component";
    uVar10 = 0;
    bVar7 = false;
    do {
      if ((((long)(dirtyMask->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var4) *
           8 == -(ulong)(dirtyMask->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset) ||
         ((p_Var4[uVar10 >> 6 & 0x3ffffff] >> (uVar10 & 0x3f) & 1) == 0)) {
        uVar5 = uVar5 + 1;
        fVar1 = paVar8->x;
        if ((0x7f7fffff < (uint)ABS(fVar1)) ||
           ((fVar2 = paVar8->y, 0x7f7fffff < (uint)ABS(fVar2) ||
            (fVar3 = paVar8->z, 0x7f7fffff < (uint)ABS(fVar3))))) break;
        if ((!mayBeZero) &&
           (((((fVar1 == 0.0 && (!NAN(fVar1))) && (fVar2 == 0.0)) &&
             ((!NAN(fVar2) && (fVar3 == 0.0)))) && (!NAN(fVar3))))) {
          pcVar6 = "Found zero-length vector";
          break;
        }
        if (uVar10 != 0) {
          if ((fVar1 == paVar8[-1].x) && (!NAN(fVar1) && !NAN(paVar8[-1].x))) {
            if ((fVar2 == paVar8[-1].y) && (!NAN(fVar2) && !NAN(paVar8[-1].y))) {
              if ((fVar3 == paVar8[-1].z) && (!NAN(fVar3) && !NAN(paVar8[-1].z))) goto LAB_003a30ca;
            }
          }
          bVar7 = true;
        }
      }
LAB_003a30ca:
      uVar10 = uVar10 + 1;
      bVar11 = uVar10 < num;
      paVar8 = paVar8 + 1;
    } while (num != uVar10);
    pcVar9 = (char *)0x0;
    local_1d8 = "All vectors are identical";
    if (mayBeIdentical) {
      local_1d8 = pcVar9;
    }
    if (bVar7) {
      local_1d8 = pcVar9;
    }
    if (uVar5 < 2) {
      local_1d8 = pcVar9;
    }
    if (bVar11) {
      local_1d8 = pcVar6;
    }
    if (local_1d8 == (char *)0x0) {
      uVar5 = 0;
    }
    else {
      local_1d0 = name;
      this = Assimp::DefaultLogger::get();
      Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[38]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [38])"FindInvalidDataProcess fails on mesh ");
      this_00 = (ostream *)
                Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                ::operator_(local_1a8,&local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,": ",2);
      Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)this_00,
                &local_1d8);
      std::__cxx11::stringbuf::str();
      Assimp::Logger::error(this,(char *)local_1c8);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if (*in != (aiVector3t<float> *)0x0) {
        operator_delete__(*in);
      }
      *in = (aiVector3t<float> *)0x0;
      uVar5 = 1;
    }
  }
  return SUB41(uVar5,0);
}

Assistant:

inline 
bool ProcessArray(T*& in, unsigned int num,const char* name,
        const std::vector<bool>& dirtyMask, bool mayBeIdentical = false, bool mayBeZero = true) {
    const char* err = ValidateArrayContents(in,num,dirtyMask,mayBeIdentical,mayBeZero);
    if (err)    {
        ASSIMP_LOG_ERROR_F( "FindInvalidDataProcess fails on mesh ", name, ": ", err);
        delete[] in;
        in = NULL;
        return true;
    }
    return false;
}